

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O1

void __thiscall
BIP324Cipher::Initialize
          (BIP324Cipher *this,EllSwiftPubKey *their_pubkey,bool initiator,bool self_decrypt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  array<unsigned_char,_32UL> *t;
  CChainParams *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  array<std::byte,_16UL> *paVar6;
  undefined8 uVar7;
  BIP324Cipher *pBVar8;
  optional<FSChaCha20Poly1305> *poVar9;
  bool bVar10;
  long in_FS_OFFSET;
  array<std::byte,_32UL> hkdf_32_okm;
  CHKDF_HMAC_SHA256_L32 hkdf;
  ECDHSecret ecdh_secret;
  string salt;
  undefined1 local_d8 [8];
  array<unsigned_char,_32UL> *paStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  array<std::byte,_32UL> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = Params();
  paVar2 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"bitcoin_v2_shared_secret","")
  ;
  __s = &local_98.field_2;
  local_98.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(pCVar4->pchMessageStart)._M_elems;
  local_98._M_string_length = 4;
  local_98.field_2._M_allocated_capacity._4_4_ =
       local_98.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    uVar7 = local_78.field_2._M_allocated_capacity;
  }
  local_98._M_dataplus._M_p = (pointer)__s;
  if (((ulong)uVar7 < local_78._M_string_length + 4) && (local_78._M_string_length + 4 < 0x10)) {
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_98,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
  }
  else {
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_78,__s->_M_local_buf,4);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if (paVar3 == paVar1) {
    local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)paVar3;
  }
  local_58._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != __s) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                             local_98.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  CKey::ComputeBIP324ECDHSecret
            ((ECDHSecret *)&local_78,&this->m_key,their_pubkey,&this->m_our_pubkey,initiator);
  CHKDF_HMAC_SHA256_L32::CHKDF_HMAC_SHA256_L32
            ((CHKDF_HMAC_SHA256_L32 *)&local_98,(uchar *)&local_78,0x20,&local_58);
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"initiator_L","");
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)&local_98,(string *)local_d8,local_b8._M_elems);
  bVar10 = self_decrypt != initiator;
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  pBVar8 = (BIP324Cipher *)&this->m_recv_l_cipher;
  if (bVar10) {
    pBVar8 = this;
  }
  std::optional<FSChaCha20>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (&pBVar8->m_send_l_cipher,&local_b8,&REKEY_INTERVAL);
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"initiator_P","");
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)&local_98,(string *)local_d8,local_b8._M_elems);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  poVar9 = &this->m_recv_p_cipher;
  if (bVar10) {
    poVar9 = &this->m_send_p_cipher;
  }
  std::optional<FSChaCha20Poly1305>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (poVar9,&local_b8,&REKEY_INTERVAL);
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"responder_L","");
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)&local_98,(string *)local_d8,local_b8._M_elems);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  pBVar8 = (BIP324Cipher *)&this->m_recv_l_cipher;
  if (!bVar10) {
    pBVar8 = this;
  }
  std::optional<FSChaCha20>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (&pBVar8->m_send_l_cipher,&local_b8,&REKEY_INTERVAL);
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"responder_P","");
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)&local_98,(string *)local_d8,local_b8._M_elems);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  poVar9 = &this->m_send_p_cipher;
  if (bVar10) {
    poVar9 = &this->m_recv_p_cipher;
  }
  std::optional<FSChaCha20Poly1305>::emplace<std::array<std::byte,32ul>&,unsigned_int_const&>
            (poVar9,&local_b8,&REKEY_INTERVAL);
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"garbage_terminators","");
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)&local_98,(string *)local_d8,local_b8._M_elems);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  paVar6 = &this->m_recv_garbage_terminator;
  if (initiator) {
    paVar6 = &this->m_send_garbage_terminator;
  }
  *(undefined8 *)paVar6->_M_elems = local_b8._M_elems._0_8_;
  *(undefined8 *)(paVar6->_M_elems + 8) = local_b8._M_elems._8_8_;
  paVar6 = &this->m_send_garbage_terminator;
  if (initiator) {
    paVar6 = &this->m_recv_garbage_terminator;
  }
  *(undefined4 *)paVar6->_M_elems = local_b8._M_elems._16_4_;
  *(undefined4 *)(paVar6->_M_elems + 4) = local_b8._M_elems._20_4_;
  *(undefined4 *)(paVar6->_M_elems + 8) = local_b8._M_elems._24_4_;
  *(undefined4 *)(paVar6->_M_elems + 0xc) = local_b8._M_elems._28_4_;
  local_d8 = (undefined1  [8])&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"session_id","");
  CHKDF_HMAC_SHA256_L32::Expand32
            ((CHKDF_HMAC_SHA256_L32 *)&local_98,(string *)local_d8,(this->m_session_id)._M_elems);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  memory_cleanse(&local_78,0x20);
  memory_cleanse(&local_b8,0x20);
  memory_cleanse(&local_98,0x20);
  local_d8 = (undefined1  [8])0x0;
  (this->m_key).fCompressed = false;
  paStack_d0 = (array<unsigned_char,_32UL> *)0x0;
  t = (this->m_key).keydata._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  (this->m_key).keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_32UL> *)0x0;
  if (t != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&(this->m_key).keydata,t);
  }
  if (paStack_d0 != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&paStack_d0,paStack_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BIP324Cipher::Initialize(const EllSwiftPubKey& their_pubkey, bool initiator, bool self_decrypt) noexcept
{
    // Determine salt (fixed string + network magic bytes)
    const auto& message_header = Params().MessageStart();
    std::string salt = std::string{"bitcoin_v2_shared_secret"} + std::string(std::begin(message_header), std::end(message_header));

    // Perform ECDH to derive shared secret.
    ECDHSecret ecdh_secret = m_key.ComputeBIP324ECDHSecret(their_pubkey, m_our_pubkey, initiator);

    // Derive encryption keys from shared secret, and initialize stream ciphers and AEADs.
    bool side = (initiator != self_decrypt);
    CHKDF_HMAC_SHA256_L32 hkdf(UCharCast(ecdh_secret.data()), ecdh_secret.size(), salt);
    std::array<std::byte, 32> hkdf_32_okm;
    hkdf.Expand32("initiator_L", UCharCast(hkdf_32_okm.data()));
    (side ? m_send_l_cipher : m_recv_l_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("initiator_P", UCharCast(hkdf_32_okm.data()));
    (side ? m_send_p_cipher : m_recv_p_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("responder_L", UCharCast(hkdf_32_okm.data()));
    (side ? m_recv_l_cipher : m_send_l_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);
    hkdf.Expand32("responder_P", UCharCast(hkdf_32_okm.data()));
    (side ? m_recv_p_cipher : m_send_p_cipher).emplace(hkdf_32_okm, REKEY_INTERVAL);

    // Derive garbage terminators from shared secret.
    hkdf.Expand32("garbage_terminators", UCharCast(hkdf_32_okm.data()));
    std::copy(std::begin(hkdf_32_okm), std::begin(hkdf_32_okm) + GARBAGE_TERMINATOR_LEN,
        (initiator ? m_send_garbage_terminator : m_recv_garbage_terminator).begin());
    std::copy(std::end(hkdf_32_okm) - GARBAGE_TERMINATOR_LEN, std::end(hkdf_32_okm),
        (initiator ? m_recv_garbage_terminator : m_send_garbage_terminator).begin());

    // Derive session id from shared secret.
    hkdf.Expand32("session_id", UCharCast(m_session_id.data()));

    // Wipe all variables that contain information which could be used to re-derive encryption keys.
    memory_cleanse(ecdh_secret.data(), ecdh_secret.size());
    memory_cleanse(hkdf_32_okm.data(), sizeof(hkdf_32_okm));
    memory_cleanse(&hkdf, sizeof(hkdf));
    m_key = CKey();
}